

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprSwitch * AnalyzeSwitch(ExpressionContext *ctx,SynSwitch *syntax)

{
  bool bVar1;
  int iVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  _func_int **pp_Var6;
  ExprBase *lhs;
  SynBase *source;
  undefined4 extraout_var_01;
  ExprSwitch *pEVar7;
  SynSwitchCase *source_00;
  undefined1 auVar8 [16];
  int iVar9;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprBase> blocks;
  IntrusiveList<ExprBase> cases;
  ExprBase *local_88;
  ExprBase *local_78;
  VariableData *local_70;
  IntrusiveList<ExprBase> local_68;
  IntrusiveList<ExprBase> local_58;
  IntrusiveList<ExprBase> local_48;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  ExpressionContext::PushLoopScope(ctx,true,false);
  local_78 = AnalyzeExpression(ctx,syntax->condition);
  pTVar4 = local_78->type;
  if (pTVar4 == ctx->typeVoid) {
    anon_unknown.dwarf_9c70f::Report
              (ctx,syntax->condition,"ERROR: condition type cannot be \'%.*s\'");
    pTVar4 = local_78->type;
  }
  if ((pTVar4 == (TypeBase *)0x0) || (pTVar4->typeID != 0)) {
    bVar1 = AssertValueExpression(ctx,syntax->condition,local_78);
    pSVar3 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    if (bVar1) {
      pTVar4 = local_78->type;
    }
    else {
      pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    }
    local_70 = anon_unknown.dwarf_9c70f::AllocateTemporary(ctx,pSVar3,pTVar4);
    pSVar3 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    pEVar5 = CreateVariableAccess(ctx,pSVar3,local_70,false);
    pEVar5 = CreateAssignment(ctx,syntax->condition,pEVar5,local_78);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    local_78 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pSVar3 = syntax->condition;
    pTVar4 = ctx->typeVoid;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var6 = (_func_int **)CONCAT44(extraout_var_00,iVar2);
    *pp_Var6 = (_func_int *)0x0;
    pp_Var6[1] = (_func_int *)local_70;
    pp_Var6[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var6 + 3) = 0;
    local_78->typeID = 0x1e;
    local_78->source = pSVar3;
    local_78->type = pTVar4;
    local_78->next = (ExprBase *)0x0;
    local_78->listed = false;
    local_78->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
    local_78[1]._vptr_ExprBase = pp_Var6;
    *(ExprBase **)&local_78[1].typeID = pEVar5;
  }
  else {
    local_70 = (VariableData *)0x0;
  }
  local_48.head = (ExprBase *)0x0;
  local_48.tail = (ExprBase *)0x0;
  local_58.head = (ExprBase *)0x0;
  local_58.tail = (ExprBase *)0x0;
  source_00 = (syntax->cases).head;
  if (source_00 == (SynSwitchCase *)0x0) {
    local_88 = (ExprBase *)0x0;
  }
  else {
    local_88 = (ExprBase *)0x0;
    do {
      if (source_00->value != (SynBase *)0x0) {
        lhs = AnalyzeExpression(ctx,source_00->value);
        pTVar4 = lhs->type;
        pEVar5 = lhs;
        if (((pTVar4 == (TypeBase *)0x0) || (pTVar4->typeID != 0)) &&
           ((local_78->type == (TypeBase *)0x0 || (local_78->type->typeID != 0)))) {
          if (pTVar4 == ctx->typeVoid) {
            anon_unknown.dwarf_9c70f::Report
                      (ctx,syntax->condition,"ERROR: case value type cannot be \'%.*s\'");
          }
          pSVar3 = source_00->value;
          source = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
          pEVar5 = CreateVariableAccess(ctx,source,local_70,false);
          pEVar5 = CreateBinaryOp(ctx,pSVar3,SYN_BINARY_OP_EQUAL,lhs,pEVar5);
          pTVar4 = pEVar5->type;
          iVar2 = (int)pTVar4;
          iVar9 = (int)((ulong)pTVar4 >> 0x20);
          auVar8._0_4_ = -(uint)(*(int *)((long)&ctx->typeBool + 4) == iVar9 &&
                                *(int *)&ctx->typeBool == iVar2);
          auVar8._4_4_ = -(uint)(*(int *)&ctx->typeChar == iVar2 &&
                                *(int *)((long)&ctx->typeChar + 4) == iVar9);
          auVar8._8_4_ = -(uint)(*(int *)((long)&ctx->typeShort + 4) == iVar9 &&
                                *(int *)&ctx->typeShort == iVar2);
          auVar8._12_4_ =
               -(uint)(*(int *)&ctx->typeInt == iVar2 && *(int *)((long)&ctx->typeInt + 4) == iVar9)
          ;
          iVar2 = movmskps((int)lhs,auVar8);
          if ((iVar2 == 0) || (pTVar4 == ctx->typeLong)) {
            anon_unknown.dwarf_9c70f::Report
                      (ctx,&source_00->super_SynBase,
                       "ERROR: \'==\' operator result type must be bool, char, short or int");
          }
        }
        IntrusiveList<ExprBase>::push_back(&local_48,pEVar5);
      }
      local_68.head = (ExprBase *)0x0;
      local_68.tail = (ExprBase *)0x0;
      for (pSVar3 = (source_00->expressions).head; pSVar3 != (SynBase *)0x0; pSVar3 = pSVar3->next)
      {
        pEVar5 = AnalyzeStatement(ctx,pSVar3);
        IntrusiveList<ExprBase>::push_back(&local_68,pEVar5);
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar5 = (ExprBase *)CONCAT44(extraout_var_01,iVar2);
      pSVar3 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      pTVar4 = ctx->typeVoid;
      pEVar5->typeID = 0x36;
      pEVar5->source = pSVar3;
      pEVar5->type = pTVar4;
      pEVar5->next = (ExprBase *)0x0;
      pEVar5->listed = false;
      pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002240b0;
      pEVar5[1]._vptr_ExprBase = (_func_int **)local_68.head;
      *(ExprBase **)&pEVar5[1].typeID = local_68.tail;
      pEVar5[1].source = (SynBase *)0x0;
      if (source_00->value != (SynBase *)0x0) {
        IntrusiveList<ExprBase>::push_back(&local_58,pEVar5);
        pEVar5 = local_88;
      }
      local_88 = pEVar5;
      source_00 = (SynSwitchCase *)(source_00->super_SynBase).next;
    } while ((source_00 != (SynSwitchCase *)0x0) && ((source_00->super_SynBase).typeID == 0x2d));
  }
  ExpressionContext::PopScope(ctx,SCOPE_LOOP,true);
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pEVar7 = (ExprSwitch *)CONCAT44(extraout_var_02,iVar2);
  pTVar4 = ctx->typeVoid;
  (pEVar7->super_ExprBase).typeID = 0x33;
  (pEVar7->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar7->super_ExprBase).type = pTVar4;
  (pEVar7->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar7->super_ExprBase).listed = false;
  (pEVar7->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00224388;
  pEVar7->condition = local_78;
  (pEVar7->cases).head = local_48.head;
  (pEVar7->cases).tail = local_48.tail;
  (pEVar7->blocks).head = local_58.head;
  (pEVar7->blocks).tail = local_58.tail;
  pEVar7->defaultBlock = local_88;
  return pEVar7;
}

Assistant:

ExprSwitch* AnalyzeSwitch(ExpressionContext &ctx, SynSwitch *syntax)
{
	ctx.PushLoopScope(true, false);

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	if(condition->type == ctx.typeVoid)
		Report(ctx, syntax->condition, "ERROR: condition type cannot be '%.*s'", FMT_ISTR(condition->type->name));

	VariableData *conditionVariable = NULL;
	
	if(!isType<TypeError>(condition->type))
	{
		if(!AssertValueExpression(ctx, syntax->condition, condition))
			conditionVariable = AllocateTemporary(ctx, ctx.MakeInternal(syntax), ctx.GetErrorType());
		else
			conditionVariable = AllocateTemporary(ctx, ctx.MakeInternal(syntax), condition->type);

		ExprBase *access = CreateVariableAccess(ctx, ctx.MakeInternal(syntax), conditionVariable, false);

		ExprBase *initializer = CreateAssignment(ctx, syntax->condition, access, condition);

		condition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax->condition, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, conditionVariable), initializer);
	}

	IntrusiveList<ExprBase> cases;
	IntrusiveList<ExprBase> blocks;
	ExprBase *defaultBlock = NULL;

	for(SynSwitchCase *curr = syntax->cases.head; curr; curr = getType<SynSwitchCase>(curr->next))
	{
		if(curr->value)
		{
			ExprBase *caseValue = AnalyzeExpression(ctx, curr->value);

			if(isType<TypeError>(caseValue->type) || isType<TypeError>(condition->type))
			{
				cases.push_back(caseValue);
			}
			else
			{
				if(caseValue->type == ctx.typeVoid)
					Report(ctx, syntax->condition, "ERROR: case value type cannot be '%.*s'", FMT_ISTR(caseValue->type->name));

				ExprBase *conditionValue = CreateBinaryOp(ctx, curr->value, SYN_BINARY_OP_EQUAL, caseValue, CreateVariableAccess(ctx, ctx.MakeInternal(syntax), conditionVariable, false));

				if(!ctx.IsIntegerType(conditionValue->type) || conditionValue->type == ctx.typeLong)
					Report(ctx, curr, "ERROR: '==' operator result type must be bool, char, short or int");

				cases.push_back(conditionValue);
			}
		}

		IntrusiveList<ExprBase> expressions;

		for(SynBase *expression = curr->expressions.head; expression; expression = expression->next)
			expressions.push_back(AnalyzeStatement(ctx, expression));

		ExprBase *block = new (ctx.get<ExprBlock>()) ExprBlock(ctx.MakeInternal(syntax), ctx.typeVoid, expressions, NULL);

		if(curr->value)
			blocks.push_back(block);
		else
			defaultBlock = block;
	}

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprSwitch>()) ExprSwitch(syntax, ctx.typeVoid, condition, cases, blocks, defaultBlock);
}